

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lex.c
# Opt level: O2

LexToken lex_scan(LexState *ls,TValue *tv)

{
  SBuf *sb;
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  byte *pbVar5;
  GCstr *pGVar6;
  char *pcVar7;
  byte bVar8;
  uint32_t uVar9;
  ErrMsg em;
  LexToken tok;
  ulong uVar10;
  
  sb = &ls->sb;
  (ls->sb).p.ptr32 = (ls->sb).b.ptr32;
LAB_00126b89:
  do {
    uVar2 = ls->c;
    uVar10 = (ulong)(int)uVar2;
    if ((char)""[uVar10 + 1] < '\0') {
      if ((""[uVar10 + 1] & 8) == 0) {
        do {
          uVar2 = (ls->sb).p.ptr32;
          pcVar7 = (char *)(ulong)uVar2;
          if ((ls->sb).e.ptr32 == uVar2) {
            pcVar7 = lj_buf_more2(sb,1);
          }
          *pcVar7 = (char)uVar10;
          (ls->sb).p.ptr32 = (int)pcVar7 + 1;
          pbVar5 = (byte *)ls->p;
          if (pbVar5 < ls->pe) {
            ls->p = (char *)(pbVar5 + 1);
            uVar10 = (ulong)*pbVar5;
          }
          else {
            uVar2 = lex_more(ls);
            uVar10 = (ulong)uVar2;
          }
          ls->c = (int)uVar10;
        } while ((char)""[(long)(int)uVar10 + 1] < '\0');
        uVar2 = (ls->sb).b.ptr32;
        pGVar6 = lj_parse_keepstr(ls,(char *)(ulong)uVar2,(ulong)((ls->sb).p.ptr32 - uVar2));
        (tv->u32).lo = (uint32_t)pGVar6;
        (tv->field_2).it = 0xfffffffb;
        if (pGVar6->reserved == 0) {
          return 0x11f;
        }
        return pGVar6->reserved | 0x100;
      }
LAB_0012761b:
      lex_number(ls,tv);
      return 0x11e;
    }
    if ((uVar2 - 0xb < 2) || (uVar2 == 9)) {
LAB_00126bdd:
      pbVar5 = (byte *)ls->p;
      if (pbVar5 < ls->pe) {
        ls->p = (char *)(pbVar5 + 1);
        uVar2 = (uint)*pbVar5;
      }
      else {
        uVar2 = lex_more(ls);
      }
      ls->c = uVar2;
      goto LAB_00126b89;
    }
    if ((uVar2 != 10) && (uVar2 != 0xd)) {
      if (uVar2 == 0x20) goto LAB_00126bdd;
      if (uVar2 != 0x2d) {
        switch(uVar2) {
        case 0x3a:
          pbVar5 = (byte *)ls->p;
          if (pbVar5 < ls->pe) {
            ls->p = (char *)(pbVar5 + 1);
            uVar2 = (uint)*pbVar5;
          }
          else {
            uVar2 = lex_more(ls);
          }
          ls->c = uVar2;
          if (uVar2 == 0x3a) {
            pbVar5 = (byte *)ls->p;
            if (pbVar5 < ls->pe) {
              ls->p = (char *)(pbVar5 + 1);
              uVar2 = (uint)*pbVar5;
            }
            else {
              uVar2 = lex_more(ls);
            }
            ls->c = uVar2;
            return 0x11d;
          }
          return 0x3a;
        case 0x3b:
          goto switchD_00126d7e_caseD_3b;
        case 0x3c:
          pbVar5 = (byte *)ls->p;
          if (pbVar5 < ls->pe) {
            ls->p = (char *)(pbVar5 + 1);
            uVar2 = (uint)*pbVar5;
          }
          else {
            uVar2 = lex_more(ls);
          }
          ls->c = uVar2;
          if (uVar2 == 0x3d) {
            pbVar5 = (byte *)ls->p;
            if (pbVar5 < ls->pe) {
              ls->p = (char *)(pbVar5 + 1);
              uVar2 = (uint)*pbVar5;
            }
            else {
              uVar2 = lex_more(ls);
            }
            ls->c = uVar2;
            return 0x11b;
          }
          return 0x3c;
        case 0x3d:
          pbVar5 = (byte *)ls->p;
          if (pbVar5 < ls->pe) {
            ls->p = (char *)(pbVar5 + 1);
            uVar2 = (uint)*pbVar5;
          }
          else {
            uVar2 = lex_more(ls);
          }
          ls->c = uVar2;
          if (uVar2 == 0x3d) {
            pbVar5 = (byte *)ls->p;
            if (pbVar5 < ls->pe) {
              ls->p = (char *)(pbVar5 + 1);
              uVar2 = (uint)*pbVar5;
            }
            else {
              uVar2 = lex_more(ls);
            }
            ls->c = uVar2;
            return 0x119;
          }
          return 0x3d;
        case 0x3e:
          pbVar5 = (byte *)ls->p;
          if (pbVar5 < ls->pe) {
            ls->p = (char *)(pbVar5 + 1);
            uVar2 = (uint)*pbVar5;
          }
          else {
            uVar2 = lex_more(ls);
          }
          ls->c = uVar2;
          if (uVar2 == 0x3d) {
            pbVar5 = (byte *)ls->p;
            if (pbVar5 < ls->pe) {
              ls->p = (char *)(pbVar5 + 1);
              uVar2 = (uint)*pbVar5;
            }
            else {
              uVar2 = lex_more(ls);
            }
            ls->c = uVar2;
            return 0x11a;
          }
          return 0x3e;
        default:
          if (uVar2 == 0xffffffff) {
            return 0x121;
          }
          if ((uVar2 == 0x22) || (uVar2 == 0x27)) {
            uVar4 = (ls->sb).p.ptr32;
            pcVar7 = (char *)(ulong)uVar4;
            if ((ls->sb).e.ptr32 == uVar4) {
              pcVar7 = lj_buf_more2(sb,1);
            }
            *pcVar7 = (char)uVar2;
            (ls->sb).p.ptr32 = (int)pcVar7 + 1;
            pbVar5 = (byte *)ls->p;
            if (pbVar5 < ls->pe) {
              ls->p = (char *)(pbVar5 + 1);
              uVar4 = (uint)*pbVar5;
            }
            else {
              uVar4 = lex_more(ls);
            }
            ls->c = uVar4;
            goto LAB_00126ee2;
          }
          if (uVar2 == 0x2e) {
            uVar2 = (ls->sb).p.ptr32;
            pcVar7 = (char *)(ulong)uVar2;
            if ((ls->sb).e.ptr32 == uVar2) {
              pcVar7 = lj_buf_more2(sb,1);
            }
            *pcVar7 = '.';
            (ls->sb).p.ptr32 = (int)pcVar7 + 1;
            pbVar5 = (byte *)ls->p;
            if (pbVar5 < ls->pe) {
              ls->p = (char *)(pbVar5 + 1);
              uVar2 = (uint)*pbVar5;
            }
            else {
              uVar2 = lex_more(ls);
            }
            ls->c = uVar2;
            if (uVar2 == 0x2e) {
              pbVar5 = (byte *)ls->p;
              if (pbVar5 < ls->pe) {
                ls->p = (char *)(pbVar5 + 1);
                uVar2 = (uint)*pbVar5;
              }
              else {
                uVar2 = lex_more(ls);
              }
              ls->c = uVar2;
              if (uVar2 == 0x2e) {
                pbVar5 = (byte *)ls->p;
                if (pbVar5 < ls->pe) {
                  ls->p = (char *)(pbVar5 + 1);
                  uVar2 = (uint)*pbVar5;
                }
                else {
                  uVar2 = lex_more(ls);
                }
                ls->c = uVar2;
                return 0x118;
              }
              return 0x117;
            }
            if ((""[(long)(int)uVar2 + 1] & 8) == 0) {
              return 0x2e;
            }
            goto LAB_0012761b;
          }
          if (uVar2 == 0x5b) {
            iVar1 = lex_skipeq(ls);
            if (-1 < iVar1) {
              lex_longstring(ls,tv,iVar1);
              return 0x120;
            }
            if (iVar1 == -1) {
              return 0x5b;
            }
            tok = 0x120;
            em = LJ_ERR_XLDELIM;
            goto LAB_0012777d;
          }
          if (uVar2 == 0x7e) {
            pbVar5 = (byte *)ls->p;
            if (pbVar5 < ls->pe) {
              ls->p = (char *)(pbVar5 + 1);
              uVar2 = (uint)*pbVar5;
            }
            else {
              uVar2 = lex_more(ls);
            }
            ls->c = uVar2;
            if (uVar2 == 0x3d) {
              pbVar5 = (byte *)ls->p;
              if (pbVar5 < ls->pe) {
                ls->p = (char *)(pbVar5 + 1);
                uVar2 = (uint)*pbVar5;
              }
              else {
                uVar2 = lex_more(ls);
              }
              ls->c = uVar2;
              return 0x11c;
            }
            return 0x7e;
          }
switchD_00126d7e_caseD_3b:
          pbVar5 = (byte *)ls->p;
          if (pbVar5 < ls->pe) {
            ls->p = (char *)(pbVar5 + 1);
            uVar4 = (uint)*pbVar5;
          }
          else {
            uVar4 = lex_more(ls);
          }
          ls->c = uVar4;
          return uVar2;
        }
      }
      pbVar5 = (byte *)ls->p;
      if (pbVar5 < ls->pe) {
        ls->p = (char *)(pbVar5 + 1);
        uVar2 = (uint)*pbVar5;
      }
      else {
        uVar2 = lex_more(ls);
      }
      ls->c = uVar2;
      if (uVar2 != 0x2d) {
        return 0x2d;
      }
      pbVar5 = (byte *)ls->p;
      if (pbVar5 < ls->pe) {
        ls->p = (char *)(pbVar5 + 1);
        uVar2 = (uint)*pbVar5;
      }
      else {
        uVar2 = lex_more(ls);
      }
      ls->c = uVar2;
      if (uVar2 == 0x5b) {
        iVar1 = lex_skipeq(ls);
        (ls->sb).p.ptr32 = (ls->sb).b.ptr32;
        if (-1 < iVar1) {
          lex_longstring(ls,(TValue *)0x0,iVar1);
          (ls->sb).p.ptr32 = (ls->sb).b.ptr32;
          goto LAB_00126b89;
        }
        uVar2 = ls->c;
      }
      while ((0xe < uVar2 + 1 || ((0x4801U >> (uVar2 + 1 & 0x1f) & 1) == 0))) {
        pbVar5 = (byte *)ls->p;
        if (pbVar5 < ls->pe) {
          ls->p = (char *)(pbVar5 + 1);
          uVar2 = (uint)*pbVar5;
        }
        else {
          uVar2 = lex_more(ls);
        }
        ls->c = uVar2;
      }
      goto LAB_00126b89;
    }
    lex_newline(ls);
  } while( true );
LAB_00126ee2:
  if (uVar4 == uVar2) {
    uVar4 = (ls->sb).p.ptr32;
    pcVar7 = (char *)(ulong)uVar4;
    if ((ls->sb).e.ptr32 == uVar4) {
      pcVar7 = lj_buf_more2(sb,1);
    }
    uVar9 = (int)pcVar7 + 1;
    *pcVar7 = (char)uVar2;
    (ls->sb).p.ptr32 = uVar9;
    pbVar5 = (byte *)ls->p;
    if (pbVar5 < ls->pe) {
      ls->p = (char *)(pbVar5 + 1);
      uVar2 = (uint)*pbVar5;
    }
    else {
      uVar2 = lex_more(ls);
      uVar9 = (ls->sb).p.ptr32;
    }
    ls->c = uVar2;
    uVar2 = (ls->sb).b.ptr32;
    pGVar6 = lj_parse_keepstr(ls,(char *)((ulong)uVar2 + 1),(ulong)((uVar9 - uVar2) - 2));
    (tv->u32).lo = (uint32_t)pGVar6;
    (tv->field_2).it = 0xfffffffb;
    return 0x120;
  }
  if (uVar4 != 0x5c) {
    if ((uVar4 == 0xd) || (uVar4 == 10)) {
      tok = 0x120;
    }
    else {
      if (uVar4 != 0xffffffff) {
        uVar3 = (ls->sb).p.ptr32;
        pcVar7 = (char *)(ulong)uVar3;
        if ((ls->sb).e.ptr32 == uVar3) {
          pcVar7 = lj_buf_more2(sb,1);
        }
        *pcVar7 = (char)uVar4;
        (ls->sb).p.ptr32 = (int)pcVar7 + 1;
        pbVar5 = (byte *)ls->p;
        if (pbVar5 < ls->pe) {
          ls->p = (char *)(pbVar5 + 1);
          uVar4 = (uint)*pbVar5;
        }
        else {
          uVar4 = lex_more(ls);
        }
        ls->c = uVar4;
        goto LAB_00126ee2;
      }
      tok = 0x121;
    }
    em = LJ_ERR_XSTR;
LAB_0012777d:
    lj_lex_error(ls,tok,em);
  }
  pbVar5 = (byte *)ls->p;
  if (pbVar5 < ls->pe) {
    ls->p = (char *)(pbVar5 + 1);
    uVar4 = (uint)*pbVar5;
  }
  else {
    uVar4 = lex_more(ls);
  }
  ls->c = uVar4;
  switch(uVar4) {
  case 0x6e:
    uVar4 = 10;
    break;
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x73:
  case 0x77:
  case 0x79:
switchD_00126ff0_caseD_6f:
    if ((""[(long)(int)uVar4 + 1] & 8) != 0) {
      pbVar5 = (byte *)ls->p;
      if (pbVar5 < ls->pe) {
        ls->p = (char *)(pbVar5 + 1);
        uVar3 = (uint)*pbVar5;
      }
      else {
        uVar3 = lex_more(ls);
      }
      iVar1 = uVar4 - 0x30;
      ls->c = uVar3;
      if ((""[(long)(int)uVar3 + 1] & 8) != 0) {
        pbVar5 = (byte *)ls->p;
        if (pbVar5 < ls->pe) {
          ls->p = (char *)(pbVar5 + 1);
          uVar4 = (uint)*pbVar5;
        }
        else {
          uVar4 = lex_more(ls);
        }
        iVar1 = iVar1 * 10 + uVar3 + -0x30;
        ls->c = uVar4;
        if ((""[(long)(int)uVar4 + 1] & 8) != 0) {
          iVar1 = iVar1 * 10 + uVar4 + -0x30;
          if (0xff < iVar1) goto LAB_00127757;
          pbVar5 = (byte *)ls->p;
          if (pbVar5 < ls->pe) {
            ls->p = (char *)(pbVar5 + 1);
            uVar4 = (uint)*pbVar5;
          }
          else {
            uVar4 = lex_more(ls);
          }
          ls->c = uVar4;
        }
      }
      uVar4 = (ls->sb).p.ptr32;
      pcVar7 = (char *)(ulong)uVar4;
      if ((ls->sb).e.ptr32 == uVar4) {
        pcVar7 = lj_buf_more2(sb,1);
      }
      *pcVar7 = (char)iVar1;
      (sb->p).ptr32 = (int)pcVar7 + 1;
      goto LAB_00127119;
    }
LAB_00127757:
    tok = 0x120;
    em = LJ_ERR_XESC;
    goto LAB_0012777d;
  case 0x72:
    uVar4 = 0xd;
    break;
  case 0x74:
    uVar4 = 9;
    break;
  case 0x75:
    pbVar5 = (byte *)ls->p;
    if (pbVar5 < ls->pe) {
      ls->p = (char *)(pbVar5 + 1);
      uVar4 = (uint)*pbVar5;
    }
    else {
      uVar4 = lex_more(ls);
    }
    ls->c = uVar4;
    if (uVar4 != 0x7b) goto LAB_00127757;
    pbVar5 = (byte *)ls->p;
    if (pbVar5 < ls->pe) {
      ls->p = (char *)(pbVar5 + 1);
      uVar3 = (uint)*pbVar5;
    }
    else {
      uVar3 = lex_more(ls);
    }
    ls->c = uVar3;
    uVar4 = 0;
    do {
      uVar4 = uVar3 & 0xf | uVar4 << 4;
      if ((""[(long)(int)uVar3 + 1] & 8) == 0) {
        if ((""[(long)(int)uVar3 + 1] & 0x10) == 0) goto LAB_00127757;
        uVar4 = uVar4 + 9;
      }
      if (0x10ffff < (int)uVar4) goto LAB_00127757;
      pbVar5 = (byte *)ls->p;
      if (pbVar5 < ls->pe) {
        ls->p = (char *)(pbVar5 + 1);
        uVar3 = (uint)*pbVar5;
      }
      else {
        uVar3 = lex_more(ls);
      }
      ls->c = uVar3;
    } while (uVar3 != 0x7d);
    if ((int)uVar4 < 0x800) {
      if ((int)uVar4 < 0x80) break;
      uVar3 = (ls->sb).p.ptr32;
      pbVar5 = (byte *)(ulong)uVar3;
      if ((ls->sb).e.ptr32 == uVar3) {
        pbVar5 = (byte *)lj_buf_more2(sb,1);
      }
      bVar8 = (byte)(uVar4 >> 6) | 0xc0;
    }
    else {
      if (uVar4 < 0x10000) {
        if ((uVar4 & 0xf800) == 0xd800) goto LAB_00127757;
        uVar3 = (ls->sb).p.ptr32;
        pbVar5 = (byte *)(ulong)uVar3;
        if ((ls->sb).e.ptr32 == uVar3) {
          pbVar5 = (byte *)lj_buf_more2(sb,1);
        }
        *pbVar5 = (byte)(uVar4 >> 0xc) | 0xe0;
      }
      else {
        uVar3 = (ls->sb).p.ptr32;
        pbVar5 = (byte *)(ulong)uVar3;
        if ((ls->sb).e.ptr32 == uVar3) {
          pbVar5 = (byte *)lj_buf_more2(sb,1);
        }
        *pbVar5 = (byte)(uVar4 >> 0x12) | 0xf0;
        uVar9 = (uint32_t)(pbVar5 + 1);
        (ls->sb).p.ptr32 = uVar9;
        if ((ls->sb).e.ptr32 == uVar9) {
          pbVar5 = (byte *)lj_buf_more2(sb,1);
        }
        else {
          pbVar5 = (byte *)((ulong)(pbVar5 + 1) & 0xffffffff);
        }
        *pbVar5 = (byte)(uVar4 >> 0xc) & 0x3f | 0x80;
      }
      uVar9 = (uint32_t)(pbVar5 + 1);
      (ls->sb).p.ptr32 = uVar9;
      if ((ls->sb).e.ptr32 == uVar9) {
        pbVar5 = (byte *)lj_buf_more2(sb,1);
      }
      else {
        pbVar5 = (byte *)((ulong)(pbVar5 + 1) & 0xffffffff);
      }
      bVar8 = (byte)(uVar4 >> 6) & 0x3f | 0x80;
    }
    *pbVar5 = bVar8;
    (sb->p).ptr32 = (int)pbVar5 + 1;
    uVar4 = uVar4 & 0x3f | 0x80;
    break;
  case 0x76:
    uVar4 = 0xb;
    break;
  case 0x78:
    pbVar5 = (byte *)ls->p;
    if (pbVar5 < ls->pe) {
      ls->p = (char *)(pbVar5 + 1);
      uVar4 = (uint)*pbVar5;
    }
    else {
      uVar4 = lex_more(ls);
    }
    ls->c = uVar4;
    iVar1 = (uVar4 & 0xf) * 0x10;
    if ((""[(long)(int)uVar4 + 1] & 8) == 0) {
      if ((""[(long)(int)uVar4 + 1] & 0x10) == 0) goto LAB_00127757;
      iVar1 = iVar1 + 0x90;
    }
    pbVar5 = (byte *)ls->p;
    if (pbVar5 < ls->pe) {
      ls->p = (char *)(pbVar5 + 1);
      uVar3 = (uint)*pbVar5;
    }
    else {
      uVar3 = lex_more(ls);
    }
    ls->c = uVar3;
    uVar4 = (uVar3 & 0xf) + iVar1;
    if ((""[(long)(int)uVar3 + 1] & 8) == 0) {
      if ((""[(long)(int)uVar3 + 1] & 0x10) == 0) goto LAB_00127757;
      uVar4 = uVar4 + 9;
    }
    break;
  case 0x7a:
    do {
      pbVar5 = (byte *)ls->p;
      if (pbVar5 < ls->pe) {
        ls->p = (char *)(pbVar5 + 1);
        uVar4 = (uint)*pbVar5;
      }
      else {
        uVar4 = lex_more(ls);
      }
      ls->c = uVar4;
      while( true ) {
        if ((""[(long)(int)uVar4 + 1] & 2) == 0) goto LAB_00127119;
        if ((uVar4 != 0xd) && (uVar4 != 10)) break;
        lex_newline(ls);
        uVar4 = ls->c;
      }
    } while( true );
  default:
    if (uVar4 != 0xffffffff) {
      if ((uVar4 != 10) && (uVar4 != 0xd)) {
        if ((uVar4 != 0x22) && ((uVar4 != 0x27 && (uVar4 != 0x5c)))) {
          if (uVar4 == 0x66) {
            uVar4 = 0xc;
          }
          else if (uVar4 == 0x62) {
            uVar4 = 8;
          }
          else {
            if (uVar4 != 0x61) goto switchD_00126ff0_caseD_6f;
            uVar4 = 7;
          }
        }
        break;
      }
      uVar4 = (ls->sb).p.ptr32;
      pcVar7 = (char *)(ulong)uVar4;
      if ((ls->sb).e.ptr32 == uVar4) {
        pcVar7 = lj_buf_more2(sb,1);
      }
      *pcVar7 = '\n';
      (ls->sb).p.ptr32 = (int)pcVar7 + 1;
      lex_newline(ls);
    }
    goto LAB_00127119;
  }
  uVar3 = (ls->sb).p.ptr32;
  pcVar7 = (char *)(ulong)uVar3;
  if ((ls->sb).e.ptr32 == uVar3) {
    pcVar7 = lj_buf_more2(sb,1);
  }
  *pcVar7 = (char)uVar4;
  (ls->sb).p.ptr32 = (int)pcVar7 + 1;
  pbVar5 = (byte *)ls->p;
  if (pbVar5 < ls->pe) {
    ls->p = (char *)(pbVar5 + 1);
    uVar4 = (uint)*pbVar5;
  }
  else {
    uVar4 = lex_more(ls);
  }
  ls->c = uVar4;
LAB_00127119:
  uVar4 = ls->c;
  goto LAB_00126ee2;
}

Assistant:

static LexToken lex_scan(LexState *ls, TValue *tv)
{
  lj_buf_reset(&ls->sb);
  for (;;) {
    if (lj_char_isident(ls->c)) {
      GCstr *s;
      if (lj_char_isdigit(ls->c)) {  /* Numeric literal. */
	lex_number(ls, tv);
	return TK_number;
      }
      /* Identifier or reserved word. */
      do {
	lex_savenext(ls);
      } while (lj_char_isident(ls->c));
      s = lj_parse_keepstr(ls, sbufB(&ls->sb), sbuflen(&ls->sb));
      setstrV(ls->L, tv, s);
      if (s->reserved > 0)  /* Reserved word? */
	return TK_OFS + s->reserved;
      return TK_name;
    }
    switch (ls->c) {
    case '\n':
    case '\r':
      lex_newline(ls);
      continue;
    case ' ':
    case '\t':
    case '\v':
    case '\f':
      lex_next(ls);
      continue;
    case '-':
      lex_next(ls);
      if (ls->c != '-') return '-';
      lex_next(ls);
      if (ls->c == '[') {  /* Long comment "--[=*[...]=*]". */
	int sep = lex_skipeq(ls);
	lj_buf_reset(&ls->sb);  /* `lex_skipeq' may dirty the buffer */
	if (sep >= 0) {
	  lex_longstring(ls, NULL, sep);
	  lj_buf_reset(&ls->sb);
	  continue;
	}
      }
      /* Short comment "--.*\n". */
      while (!lex_iseol(ls) && ls->c != LEX_EOF)
	lex_next(ls);
      continue;
    case '[': {
      int sep = lex_skipeq(ls);
      if (sep >= 0) {
	lex_longstring(ls, tv, sep);
	return TK_string;
      } else if (sep == -1) {
	return '[';
      } else {
	lj_lex_error(ls, TK_string, LJ_ERR_XLDELIM);
	continue;
      }
      }
    case '=':
      lex_next(ls);
      if (ls->c != '=') return '='; else { lex_next(ls); return TK_eq; }
    case '<':
      lex_next(ls);
      if (ls->c != '=') return '<'; else { lex_next(ls); return TK_le; }
    case '>':
      lex_next(ls);
      if (ls->c != '=') return '>'; else { lex_next(ls); return TK_ge; }
    case '~':
      lex_next(ls);
      if (ls->c != '=') return '~'; else { lex_next(ls); return TK_ne; }
    case ':':
      lex_next(ls);
      if (ls->c != ':') return ':'; else { lex_next(ls); return TK_label; }
    case '"':
    case '\'':
      lex_string(ls, tv);
      return TK_string;
    case '.':
      if (lex_savenext(ls) == '.') {
	lex_next(ls);
	if (ls->c == '.') {
	  lex_next(ls);
	  return TK_dots;   /* ... */
	}
	return TK_concat;   /* .. */
      } else if (!lj_char_isdigit(ls->c)) {
	return '.';
      } else {
	lex_number(ls, tv);
	return TK_number;
      }
    case LEX_EOF:
      return TK_eof;
    default: {
      LexChar c = ls->c;
      lex_next(ls);
      return c;  /* Single-char tokens (+ - / ...). */
    }
    }
  }
}